

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,uint64_t aValue,Scope aScope)

{
  ByteArray local_40;
  Scope local_21;
  uint64_t uStack_20;
  Scope aScope_local;
  uint64_t aValue_local;
  Tlv *pTStack_10;
  Type aType_local;
  Tlv *this_local;
  
  this->mScope = aScope;
  this->mType = aType;
  local_21 = aScope;
  uStack_20 = aValue;
  aValue_local._7_1_ = aType;
  pTStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mValue);
  utils::Encode<unsigned_long>(&local_40,uStack_20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mValue,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  return;
}

Assistant:

Tlv::Tlv(Type aType, uint64_t aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
{
    mValue = utils::Encode(aValue);
}